

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# highbd_fwd_txfm_avx2.c
# Opt level: O2

void idtx16_avx2(__m256i *in,__m256i *out,int8_t bit,int col_num,int outstride)

{
  ulong uVar1;
  ulong uVar2;
  undefined1 auVar3 [32];
  undefined1 auVar4 [32];
  undefined1 auVar5 [32];
  
  uVar1 = 0;
  uVar2 = (ulong)(uint)(col_num << 4);
  if (col_num << 4 < 1) {
    uVar2 = uVar1;
  }
  auVar3._8_4_ = 0x2d42;
  auVar3._0_8_ = 0x2d4200002d42;
  auVar3._12_4_ = 0x2d42;
  auVar3._16_4_ = 0x2d42;
  auVar3._20_4_ = 0x2d42;
  auVar3._24_4_ = 0x2d42;
  auVar3._28_4_ = 0x2d42;
  auVar4._8_4_ = 0x800;
  auVar4._0_8_ = 0x80000000800;
  auVar4._12_4_ = 0x800;
  auVar4._16_4_ = 0x800;
  auVar4._20_4_ = 0x800;
  auVar4._24_4_ = 0x800;
  auVar4._28_4_ = 0x800;
  for (; uVar2 * 0x20 != uVar1; uVar1 = uVar1 + 0x20) {
    auVar5 = vpmulld_avx2(auVar3,*(undefined1 (*) [32])((long)*in + uVar1));
    auVar5 = vpaddd_avx2(auVar5,auVar4);
    auVar5 = vpsrad_avx2(auVar5,0xc);
    *(undefined1 (*) [32])((long)*out + uVar1) = auVar5;
  }
  return;
}

Assistant:

static void idtx16_avx2(__m256i *in, __m256i *out, const int8_t bit,
                        int col_num, const int outstride) {
  (void)bit;
  (void)outstride;
  __m256i fact = _mm256_set1_epi32(2 * NewSqrt2);
  __m256i offset = _mm256_set1_epi32(1 << (NewSqrt2Bits - 1));
  __m256i a_low;

  int num_iters = 16 * col_num;
  for (int i = 0; i < num_iters; i++) {
    a_low = _mm256_mullo_epi32(in[i], fact);
    a_low = _mm256_add_epi32(a_low, offset);
    out[i] = _mm256_srai_epi32(a_low, NewSqrt2Bits);
  }
}